

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cc
# Opt level: O0

void __thiscall avro::MemoryInputStream::skip(MemoryInputStream *this,size_t len)

{
  long in_RSI;
  MemoryInputStream *in_RDI;
  size_t n;
  size_t local_18;
  long local_10;
  
  local_10 = in_RSI;
  while ((local_10 != 0 && (local_18 = maxLen(in_RDI), local_18 != 0))) {
    if (in_RDI->curLen_ + local_10 < local_18) {
      local_18 = in_RDI->curLen_ + local_10;
    }
    local_10 = local_10 - (local_18 - in_RDI->curLen_);
    in_RDI->curLen_ = local_18;
  }
  return;
}

Assistant:

void skip(size_t len) {
        while (len > 0) {
            if (size_t n = maxLen()) {
                if ((curLen_ + len) < n) {
                    n = curLen_ + len;
                }
                len -= n - curLen_;
                curLen_ = n;
            } else {
                break;
            }
        }
    }